

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O3

S2Point * __thiscall S2LaxPolygonShape::loop_vertex(S2LaxPolygonShape *this,int i,int j)

{
  int iVar1;
  ulong uVar2;
  S2LogMessage SStack_28;
  
  if (i < *(int *)&(this->super_S2Shape).field_0xc) {
    iVar1 = num_loop_vertices(this,i);
    if (j < iVar1) {
      if (*(int *)&(this->super_S2Shape).field_0xc == 1) {
        uVar2 = (ulong)j;
      }
      else {
        uVar2 = (ulong)(j + (this->field_2).cumulative_vertices_[i]);
      }
      return (this->vertices_)._M_t.
             super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
             super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
             super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl + uVar2;
    }
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0x7a,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: (j) < (num_loop_vertices(i)) ",0x2b);
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0x79,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: (i) < (num_loops()) ",0x22);
  }
  abort();
}

Assistant:

const S2Point& S2LaxPolygonShape::loop_vertex(int i, int j) const {
  S2_DCHECK_LT(i, num_loops());
  S2_DCHECK_LT(j, num_loop_vertices(i));
  if (num_loops() == 1) {
    return vertices_[j];
  } else {
    return vertices_[cumulative_vertices_[i] + j];
  }
}